

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::dh_key_exchange::compute_secret(dh_key_exchange *this,key_t *remote_pubkey)

{
  hasher *this_00;
  long lVar1;
  data_type *pdVar2;
  key_t *pkVar3;
  byte bVar4;
  span<const_char> data;
  span<const_char> data_00;
  array<char,_96UL> buffer;
  hasher hStack_a8;
  sha1_hash local_9c;
  data_type local_88;
  undefined8 local_28;
  
  bVar4 = 0;
  local_88.m_data[10] = 0;
  local_88.m_data[0xb] = 0;
  local_88.m_data[8] = 0;
  local_88.m_data[9] = 0;
  local_88.m_data[6] = 0;
  local_88.m_data[7] = 0;
  local_88.m_data[4] = 0;
  local_88.m_data[5] = 0;
  local_88.m_data[2] = 0;
  local_88.m_data[3] = 0;
  local_88.m_data[0] = 0;
  local_88.m_data[1] = 0;
  local_28 = 1;
  boost::multiprecision::default_ops::
  eval_powm<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>>
            ((cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_88,&remote_pubkey->m_backend,&(this->m_dh_local_secret).m_backend,
             (cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)(anonymous_namespace)::dh_prime);
  pdVar2 = &local_88;
  pkVar3 = &this->m_dh_shared_secret;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pkVar3->m_backend).
    super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_first_limb = pdVar2->m_data[0];
    pdVar2 = (data_type *)((long)pdVar2 + (ulong)bVar4 * -0x10 + 8);
    pkVar3 = (key_t *)((long)pkVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  boost::multiprecision::
  export_bits<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_char*>
            (&this->m_dh_shared_secret,(uchar *)local_88.m_data,8,true);
  data.m_len = 4;
  data.m_ptr = "req3";
  lcrypto::hasher::hasher(&hStack_a8,data);
  data_00.m_len = 0x60;
  data_00.m_ptr = (char *)&local_88;
  this_00 = lcrypto::hasher::update(&hStack_a8,data_00);
  lcrypto::hasher::final(&local_9c,this_00);
  (this->m_xor_mask).m_number._M_elems[4] = local_9c.m_number._M_elems[4];
  *(undefined8 *)(this->m_xor_mask).m_number._M_elems = local_9c.m_number._M_elems._0_8_;
  *(undefined8 *)((this->m_xor_mask).m_number._M_elems + 2) = local_9c.m_number._M_elems._8_8_;
  lcrypto::hasher::~hasher(&hStack_a8);
  return;
}

Assistant:

void dh_key_exchange::compute_secret(key_t const& remote_pubkey)
	{
		// shared_secret = (remote_pubkey ^ local_secret) % prime
		m_dh_shared_secret = mp::powm(remote_pubkey, m_dh_local_secret, dh_prime);

		std::array<char, 96> buffer;
		mp::export_bits(m_dh_shared_secret, reinterpret_cast<std::uint8_t*>(buffer.data()), 8);

		static char const req3[4] = {'r', 'e', 'q', '3'};
		// calculate the xor mask for the obfuscated hash
		m_xor_mask = hasher(req3).update(buffer).final();
	}